

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QItemSelectionRange __thiscall
QItemSelectionRange::intersected(QItemSelectionRange *this,QItemSelectionRange *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  QAbstractItemModel *pQVar4;
  QAbstractItemModel *pQVar5;
  QPersistentModelIndex *in_RDX;
  QPersistentModelIndexData *extraout_RDX;
  QPersistentModelIndex QVar6;
  QPersistentModelIndexData *extraout_RDX_00;
  long in_FS_OFFSET;
  QItemSelectionRange QVar7;
  QModelIndex local_90;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QPersistentModelIndex::model(&other->tl);
  pQVar5 = QPersistentModelIndex::model(in_RDX);
  if (pQVar4 == pQVar5) {
    QPersistentModelIndex::parent((QModelIndex *)&local_58,&other->tl);
    QPersistentModelIndex::parent((QModelIndex *)&local_78,in_RDX);
    if (((((int)local_58 == (int)local_78) && (local_58._4_4_ == local_78._4_4_)) &&
        (puStack_50 == puStack_70)) && (local_48.ptr == local_68.ptr)) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QPersistentModelIndex::model(&other->tl);
      uVar1 = QPersistentModelIndex::row(&other->tl);
      uVar2 = QPersistentModelIndex::row(in_RDX);
      if ((int)uVar1 <= (int)uVar2) {
        uVar1 = uVar2;
      }
      uVar2 = QPersistentModelIndex::column(&other->tl);
      uVar3 = QPersistentModelIndex::column(in_RDX);
      if ((int)uVar2 <= (int)uVar3) {
        uVar2 = uVar3;
      }
      QPersistentModelIndex::parent((QModelIndex *)&local_78,in_RDX);
      (*(pQVar4->super_QObject)._vptr_QObject[0xc])
                (&local_58,pQVar4,(ulong)uVar1,(ulong)uVar2,(QModelIndex *)&local_78);
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QPersistentModelIndex::model(&other->tl);
      uVar1 = QPersistentModelIndex::row(&other->br);
      uVar2 = QPersistentModelIndex::row(in_RDX + 1);
      if ((int)uVar2 <= (int)uVar1) {
        uVar1 = uVar2;
      }
      uVar2 = QPersistentModelIndex::column(&other->br);
      uVar3 = QPersistentModelIndex::column(in_RDX + 1);
      if ((int)uVar3 <= (int)uVar2) {
        uVar2 = uVar3;
      }
      QPersistentModelIndex::parent(&local_90,in_RDX);
      (*(pQVar4->super_QObject)._vptr_QObject[0xc])
                ((QModelIndex *)&local_78,pQVar4,(ulong)uVar1,(ulong)uVar2,&local_90);
      QItemSelectionRange(this,(QModelIndex *)&local_58,(QModelIndex *)&local_78);
      QVar6.d = extraout_RDX_00;
      goto LAB_00458bb7;
    }
  }
  (this->tl).d = (QPersistentModelIndexData *)0x0;
  (this->br).d = (QPersistentModelIndexData *)0x0;
  QItemSelectionRange(this);
  QVar6.d = extraout_RDX;
LAB_00458bb7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar7.br.d = QVar6.d;
    QVar7.tl.d = (QPersistentModelIndexData *)this;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelectionRange QItemSelectionRange::intersected(const QItemSelectionRange &other) const
{
    if (model() == other.model() && parent() == other.parent()) {
        QModelIndex topLeft = model()->index(qMax(top(), other.top()),
                                             qMax(left(), other.left()),
                                             other.parent());
        QModelIndex bottomRight = model()->index(qMin(bottom(), other.bottom()),
                                                 qMin(right(), other.right()),
                                                 other.parent());
        return QItemSelectionRange(topLeft, bottomRight);
    }
    return QItemSelectionRange();
}